

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

void __thiscall Matrix4f::setSubmatrix3x3(Matrix4f *this,int i0,int j0,Matrix3f *m)

{
  float fVar1;
  float *pfVar2;
  Matrix3f *in_RCX;
  int in_EDX;
  int in_ESI;
  Matrix4f *in_RDI;
  int j;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pfVar2 = Matrix3f::operator()(in_RCX,local_1c,local_20);
      fVar1 = *pfVar2;
      pfVar2 = operator()(in_RDI,local_1c + in_ESI,local_20 + in_EDX);
      *pfVar2 = fVar1;
    }
  }
  return;
}

Assistant:

void Matrix4f::setSubmatrix3x3( int i0, int j0, const Matrix3f& m )
{
	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			( *this )( i + i0, j + j0 ) = m( i, j );
		}
	}
}